

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

void __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::rehash
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,size_t n)

{
  size_t sVar1;
  pointer ppVar2;
  pointer pvVar3;
  pointer pvVar4;
  iterator iVar5;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *bucket;
  pointer pvVar6;
  ulong uVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  pointer pvVar8;
  undefined1 *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pvVar14;
  pair<int,_int> *val_1;
  ValueT *val_00;
  ValueT *val;
  pointer ppVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  ValueT *local_78;
  iterator iStack_70;
  pair<int,_int> *local_68;
  ulong local_58;
  pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
  local_50;
  
  pvVar6 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar14 = (this->mBuckets).
            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pvVar14 - (long)pvVar6 >> 3;
  uVar7 = lVar10 * -0x5555555555555555;
  if ((uVar7 < n) ||
     (sVar1 = this->mSize, auVar16._8_4_ = (int)(sVar1 >> 0x20), auVar16._0_8_ = sVar1,
     auVar16._12_4_ = 0x45300000, auVar17._8_4_ = (int)(uVar7 >> 0x20), auVar17._0_8_ = uVar7,
     auVar17._12_4_ = 0x45300000,
     this->mMaxLoadFactor <=
     (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
            ((auVar17._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0))))) {
    uVar7 = lVar10 * 0x5555555555555556;
    if (uVar7 <= n) {
      uVar7 = n;
    }
    uVar11 = 0x100;
    puVar9 = PRIMES;
    do {
      uVar12 = uVar11 >> 1;
      uVar13 = ~uVar12 + uVar11;
      uVar11 = uVar12;
      if (*(ulong *)((long)puVar9 + uVar12 * 8) < uVar7) {
        puVar9 = (undefined1 *)((ulong *)((long)puVar9 + uVar12 * 8) + 1);
        uVar11 = uVar13;
      }
    } while (0 < (long)uVar11);
    local_78 = (ValueT *)0x0;
    iStack_70._M_current = (ValueT *)0x0;
    local_68 = (pair<int,_int> *)0x0;
    ppVar15 = (pvVar6->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pvVar8 = pvVar6;
    if ((pvVar6 != pvVar14) &&
       (pvVar3 = pvVar6,
       (pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_finish == ppVar15)) {
      do {
        pvVar8 = pvVar3 + 1;
        if (pvVar8 == pvVar14) break;
        ppVar15 = (pvVar8->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pvVar4 = pvVar3 + 1;
        pvVar3 = pvVar8;
      } while (ppVar15 ==
               (pvVar4->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    }
    ppVar2 = *(pointer *)((long)pvVar6 + ((long)pvVar14 - (long)pvVar6) + -0x10);
    uVar7 = *(ulong *)puVar9;
    if (ppVar15 != ppVar2) {
      do {
        local_58 = uVar7;
        if (iStack_70._M_current == local_68) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>const&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_78,
                     iStack_70,ppVar15);
        }
        else {
          *iStack_70._M_current = *ppVar15;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        ppVar15 = ppVar15 + 1;
        if (pvVar8 != pvVar14) {
          while ((ppVar15 ==
                  (pvVar8->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish &&
                 (pvVar8 = pvVar8 + 1, pvVar8 != pvVar14))) {
            ppVar15 = (pvVar8->
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
        }
        uVar7 = local_58;
      } while (ppVar15 != ppVar2);
      pvVar6 = (this->mBuckets).
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar14 = (this->mBuckets).
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pvVar6 != pvVar14; pvVar6 = pvVar6 + 1) {
      ppVar15 = (pvVar6->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
          _M_impl.super__Vector_impl_data._M_finish != ppVar15) {
        (pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = ppVar15;
      }
    }
    this->mSize = 0;
    std::
    vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::resize(&this->mBuckets,uVar7);
    iVar5._M_current = iStack_70._M_current;
    if (local_78 != iStack_70._M_current) {
      val_00 = local_78;
      do {
        insert(&local_50,this,val_00);
        val_00 = val_00 + 1;
      } while (val_00 != iVar5._M_current);
    }
    if (local_78 != (ValueT *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
      if (load_factor() < max_load_factor() && n <= mBuckets.size()) return;
      n = std::max(n, mBuckets.size()*2);
      n = *std::lower_bound(PRIMES,PRIMES+N_PRIMES,n);

      std::vector<ValueT> tmp;
      for (auto& val : *this) {
        tmp.push_back(val);
      }
      this->clear();
      mBuckets.resize(n);
      for (auto& val : tmp) {
        this->insert(val);
      }
    }